

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::TraverseSchema::processBaseTypeInfo
          (TraverseSchema *this,DOMElement *elem,XMLCh *baseName,XMLCh *localPart,XMLCh *uriStr,
          ComplexTypeInfo *typeInfo)

{
  SchemaInfo **enclosingSchema;
  XMLCh XVar1;
  uint saveScope;
  SchemaInfo *toRestore;
  ValueVectorOf<int> *pVVar2;
  RefHashTableOf<xercesc_4_0::ComplexTypeInfo,_xercesc_4_0::StringHasher> *pRVar3;
  ValueVectorOf<unsigned_int> *pVVar4;
  uint *puVar5;
  SchemaInfo *pSVar6;
  RefVectorOf<xercesc_4_0::SchemaInfo> *pRVar7;
  long lVar8;
  bool bVar9;
  int iVar10;
  uint uVar11;
  XMLCh *pXVar12;
  ComplexTypeInfo *pCVar13;
  DatatypeValidator *pDVar14;
  XMLSize_t XVar15;
  DOMElement *pDVar16;
  ushort *key1;
  ulong uVar17;
  SchemaInfo *toRestore_00;
  undefined4 *puVar18;
  XMLCh *pXVar19;
  RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *pRVar20;
  ushort *puVar21;
  XMLCh XVar22;
  ushort uVar23;
  ulong uVar24;
  ulong uVar25;
  XMLBuffer *this_00;
  XMLSize_t getAt;
  ListType local_68;
  undefined4 extraout_var;
  
  enclosingSchema = &this->fSchemaInfo;
  toRestore = this->fSchemaInfo;
  saveScope = this->fCurrentScope;
  pXVar12 = this->fTargetNSURIString;
  if (pXVar12 != uriStr) {
    pXVar19 = uriStr;
    if (pXVar12 == (XMLCh *)0x0 || uriStr == (XMLCh *)0x0) {
      if (uriStr == (XMLCh *)0x0) {
        if (pXVar12 != (XMLCh *)0x0) goto LAB_0033025d;
LAB_003303a4:
        (this->fBuffer).fIndex = 0;
        goto LAB_003303b5;
      }
      if (*uriStr == L'\0' && pXVar12 != (XMLCh *)0x0) {
LAB_0033025d:
        if (*pXVar12 == L'\0') goto LAB_00330299;
        goto LAB_00330263;
      }
      if (*uriStr == L'\0') goto LAB_003303a4;
      if (uriStr != L"http://www.w3.org/2001/XMLSchema") goto LAB_00330275;
LAB_00330376:
      pDVar14 = getDatatypeValidator(this,uriStr,localPart);
      if (pDVar14 != (DatatypeValidator *)0x0) {
        pCVar13 = (ComplexTypeInfo *)0x0;
        goto LAB_003306be;
      }
    }
    else {
      do {
        XVar22 = *pXVar19;
        if (XVar22 == L'\0') goto LAB_0033025d;
        XVar1 = *pXVar12;
        pXVar12 = pXVar12 + 1;
        pXVar19 = pXVar19 + 1;
      } while (XVar22 == XVar1);
LAB_00330263:
      if (uriStr == L"http://www.w3.org/2001/XMLSchema") goto LAB_00330376;
      if (uriStr == (XMLCh *)0x0) {
        pXVar12 = L"http://www.w3.org/2001/XMLSchema";
LAB_003302d9:
        if (*pXVar12 == L'\0') goto LAB_00330376;
      }
      else {
LAB_00330275:
        pXVar12 = L"http://www.w3.org/2001/XMLSchema";
        pXVar19 = uriStr;
        do {
          XVar22 = *pXVar19;
          if (XVar22 == L'\0') goto LAB_003302d9;
          pXVar19 = pXVar19 + 1;
          XVar1 = *pXVar12;
          pXVar12 = pXVar12 + 1;
        } while (XVar22 == XVar1);
      }
      iVar10 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                         (this->fURIStringPool,uriStr);
      pVVar2 = this->fImportedNSList;
      if ((pVVar2 == (ValueVectorOf<int> *)0x0) || (uVar17 = pVVar2->fCurCount, uVar17 == 0)) {
LAB_003307f4:
        iVar10 = 0x8e;
        pXVar12 = uriStr;
        goto LAB_00330810;
      }
      if (*pVVar2->fElemList != iVar10) {
        uVar24 = 0;
        do {
          if (uVar17 - 1 == uVar24) goto LAB_003307f4;
          uVar25 = uVar24 + 1;
          lVar8 = uVar24 + 1;
          uVar24 = uVar25;
        } while (pVVar2->fElemList[lVar8] != iVar10);
        if (uVar17 <= uVar25) goto LAB_003307f4;
      }
      pCVar13 = getTypeInfoFromNS(this,elem,uriStr,localPart);
      local_68 = INCLUDE;
      if (pCVar13 != (ComplexTypeInfo *)0x0) {
        pDVar14 = (DatatypeValidator *)0x0;
        goto LAB_003307c7;
      }
      pDVar14 = getDatatypeValidator(this,uriStr,localPart);
      if (pDVar14 != (DatatypeValidator *)0x0) {
        pCVar13 = (ComplexTypeInfo *)0x0;
        local_68 = INCLUDE;
        goto LAB_003307c7;
      }
      pSVar6 = this->fSchemaInfo;
      iVar10 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                         (this->fURIStringPool,uriStr);
      pRVar7 = pSVar6->fImportedInfoList;
      if ((pRVar7 != (RefVectorOf<xercesc_4_0::SchemaInfo> *)0x0) &&
         (XVar15 = (pRVar7->super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>).fCurCount, XVar15 != 0))
      {
        getAt = 0;
        do {
          toRestore_00 = BaseRefVectorOf<xercesc_4_0::SchemaInfo>::elementAt
                                   (&pSVar6->fImportedInfoList->
                                     super_BaseRefVectorOf<xercesc_4_0::SchemaInfo>,getAt);
          if (toRestore_00->fTargetNSURI == iVar10) {
            if (toRestore_00->fProcessed != true) {
              local_68 = IMPORT;
              restoreSchemaInfo(this,toRestore_00,IMPORT,0xfffffffe);
              goto LAB_0033049d;
            }
            break;
          }
          getAt = getAt + 1;
        } while (XVar15 != getAt);
      }
    }
LAB_00330733:
    iVar10 = 0x2b;
    pXVar12 = baseName;
    goto LAB_00330810;
  }
LAB_00330299:
  (this->fBuffer).fIndex = 0;
  if ((uriStr == (XMLCh *)0x0) || (*uriStr == L'\0')) {
LAB_003303b5:
    XVar15 = 0;
  }
  else {
    XMLBuffer::append(&this->fBuffer,uriStr);
    XVar15 = (this->fBuffer).fIndex;
  }
  this_00 = &this->fBuffer;
  if (XVar15 == (this->fBuffer).fCapacity) {
    XMLBuffer::ensureCapacity(this_00,1);
    XVar15 = this_00->fIndex;
  }
  (this->fBuffer).fIndex = XVar15 + 1;
  (this->fBuffer).fBuffer[XVar15] = L',';
  XMLBuffer::append(this_00,localPart);
  pXVar12 = (this->fBuffer).fBuffer;
  pXVar12[(this->fBuffer).fIndex] = L'\0';
  pRVar3 = this->fComplexTypeRegistry;
  uVar17 = (ulong)(ushort)*pXVar12;
  if (uVar17 == 0) {
    uVar17 = 0;
  }
  else {
    XVar22 = pXVar12[1];
    if (XVar22 != L'\0') {
      pXVar19 = pXVar12 + 2;
      do {
        uVar17 = (ulong)(ushort)XVar22 + (uVar17 >> 0x18) + uVar17 * 0x26;
        XVar22 = *pXVar19;
        pXVar19 = pXVar19 + 1;
      } while (XVar22 != L'\0');
    }
    uVar17 = uVar17 % pRVar3->fHashModulus;
  }
  pRVar20 = pRVar3->fBucketList[uVar17];
  local_68 = INCLUDE;
  if (pRVar20 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0) {
    do {
      bVar9 = StringHasher::equals((StringHasher *)&pRVar3->field_0x30,pXVar12,pRVar20->fKey);
      if (bVar9) {
        pCVar13 = pRVar20->fData;
        if (pCVar13 != (ComplexTypeInfo *)0x0) {
          pVVar4 = this->fCurrentTypeNameStack;
          uVar11 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                             (this->fStringPool,pXVar12);
          uVar17 = this->fCircularCheckIndex;
          uVar24 = pVVar4->fCurCount;
          if (uVar24 <= uVar17) goto LAB_003305d0;
          puVar5 = pVVar4->fElemList;
          if (puVar5[uVar17] != uVar11) goto LAB_003305b6;
          goto LAB_0033086d;
        }
        break;
      }
      pRVar20 = pRVar20->fNext;
    } while (pRVar20 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0);
  }
LAB_0033049d:
  pDVar14 = getDatatypeValidator(this,uriStr,localPart);
  if (pDVar14 != (DatatypeValidator *)0x0) {
    pCVar13 = (ComplexTypeInfo *)0x0;
    goto LAB_003307c7;
  }
  pDVar16 = SchemaInfo::getTopLevelComponent
                      (*enclosingSchema,0,L"complexType",localPart,enclosingSchema);
  if (pDVar16 != (DOMElement *)0x0) {
    uVar17 = 0;
    uVar11 = traverseComplexTypeDecl(this,pDVar16,true,(XMLCh *)0x0);
    pRVar3 = this->fComplexTypeRegistry;
    iVar10 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[10])
                       (this->fStringPool,(ulong)uVar11);
    key1 = (ushort *)CONCAT44(extraout_var,iVar10);
    if (key1 != (ushort *)0x0) {
      uVar17 = (ulong)*key1;
      if (uVar17 == 0) {
        uVar17 = 0;
      }
      else {
        uVar23 = key1[1];
        if (uVar23 != 0) {
          puVar21 = key1 + 2;
          do {
            uVar17 = (ulong)uVar23 + (uVar17 >> 0x18) + uVar17 * 0x26;
            uVar23 = *puVar21;
            puVar21 = puVar21 + 1;
          } while (uVar23 != 0);
        }
        uVar17 = uVar17 % pRVar3->fHashModulus;
      }
    }
    pRVar20 = pRVar3->fBucketList[uVar17];
    if (pRVar20 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0) {
      do {
        bVar9 = StringHasher::equals((StringHasher *)&pRVar3->field_0x30,key1,pRVar20->fKey);
        if (bVar9) {
          pCVar13 = pRVar20->fData;
          goto LAB_003307ba;
        }
        pRVar20 = pRVar20->fNext;
      } while (pRVar20 != (RefHashTableBucketElem<xercesc_4_0::ComplexTypeInfo> *)0x0);
    }
    pCVar13 = (ComplexTypeInfo *)0x0;
LAB_003307ba:
    pDVar14 = (DatatypeValidator *)0x0;
    goto LAB_003307c7;
  }
  pDVar16 = SchemaInfo::getTopLevelComponent
                      (*enclosingSchema,1,L"simpleType",localPart,enclosingSchema);
  if (pDVar16 == (DOMElement *)0x0) {
    if (toRestore != *enclosingSchema) {
      restoreSchemaInfo(this,toRestore,local_68,saveScope);
    }
    goto LAB_00330733;
  }
  pCVar13 = (ComplexTypeInfo *)0x0;
  pDVar14 = traverseSimpleTypeDecl(this,pDVar16,true,0);
  if (pDVar14 != (DatatypeValidator *)0x0) goto LAB_003307c7;
  if (toRestore != *enclosingSchema) {
    restoreSchemaInfo(this,toRestore,local_68,saveScope);
  }
  iVar10 = 0x28;
  pXVar12 = uriStr;
  goto LAB_00330813;
  while (puVar5[uVar17] != uVar11) {
LAB_003305b6:
    uVar17 = uVar17 + 1;
    if (uVar24 == uVar17) break;
  }
  if (uVar24 <= uVar17) {
LAB_003305d0:
    pVVar4 = this->fCurrentTypeNameStack;
    uVar11 = (*(this->fStringPool->super_XSerializable)._vptr_XSerializable[5])
                       (this->fStringPool,pXVar12);
    uVar17 = pVVar4->fCurCount;
    if (uVar17 != 0) {
      puVar5 = pVVar4->fElemList;
      if (*puVar5 != uVar11) {
        uVar24 = 1;
        do {
          uVar25 = uVar24;
          if (uVar17 == uVar25) break;
          uVar24 = uVar25 + 1;
        } while (puVar5[uVar25] != uVar11);
        if (uVar17 <= uVar25) goto LAB_0033061a;
      }
      typeInfo->fBaseComplexTypeInfo = pCVar13;
      puVar18 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar18 = 2;
      goto LAB_00330828;
    }
LAB_0033061a:
    if (pCVar13->fPreprocessed == true) {
      local_68 = INCLUDE;
      goto LAB_0033049d;
    }
    pDVar14 = (DatatypeValidator *)0x0;
LAB_003306be:
    local_68 = INCLUDE;
LAB_003307c7:
    if (toRestore != *enclosingSchema) {
      restoreSchemaInfo(this,toRestore,local_68,saveScope);
    }
    typeInfo->fBaseComplexTypeInfo = pCVar13;
    typeInfo->fBaseDatatypeValidator = pDVar14;
    return;
  }
LAB_0033086d:
  iVar10 = 0x56;
LAB_00330810:
  localPart = (XMLCh *)0x0;
  uriStr = pXVar12;
  pXVar12 = (XMLCh *)0x0;
LAB_00330813:
  reportSchemaError(this,elem,L"http://apache.org/xml/messages/XMLErrors",iVar10,uriStr,localPart,
                    pXVar12,(XMLCh *)0x0);
  puVar18 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar18 = 1;
LAB_00330828:
  __cxa_throw(puVar18,&ExceptionCodes::typeinfo,0);
}

Assistant:

void TraverseSchema::processBaseTypeInfo(const DOMElement* const elem,
                                         const XMLCh* const baseName,
                                         const XMLCh* const localPart,
                                         const XMLCh* const uriStr,
                                         ComplexTypeInfo* const typeInfo) {

    SchemaInfo*          saveInfo = fSchemaInfo;
    ComplexTypeInfo*     baseComplexTypeInfo = 0;
    DatatypeValidator*   baseDTValidator = 0;
    SchemaInfo::ListType infoType = SchemaInfo::INCLUDE;
    unsigned int         saveScope = fCurrentScope;

    // check if the base type is from another schema
    if (!XMLString::equals(uriStr, fTargetNSURIString)) {

        // check for datatype validator if it's schema for schema URI
        if (XMLString::equals(uriStr, SchemaSymbols::fgURI_SCHEMAFORSCHEMA)) {

            baseDTValidator = getDatatypeValidator(uriStr, localPart);

            if (!baseDTValidator) {
                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BaseTypeNotFound, baseName);
                throw TraverseSchema::InvalidComplexTypeInfo;
            }
        }
        else {

            // Make sure that we have an explicit import statement.
            // Clause 4 of Schema Representation Constraint:
            // http://www.w3.org/TR/xmlschema-1/#src-resolve
            unsigned int uriId = fURIStringPool->addOrFind(uriStr);

            if (!isImportingNS(uriId)) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uriStr);
                throw TraverseSchema::InvalidComplexTypeInfo;
            }

            baseComplexTypeInfo = getTypeInfoFromNS(elem, uriStr, localPart);

            if (!baseComplexTypeInfo) {

              baseDTValidator = getDatatypeValidator(uriStr, localPart);

              if (!baseDTValidator)
              {
                SchemaInfo* impInfo = fSchemaInfo->getImportInfo(fURIStringPool->addOrFind(uriStr));

                if (!impInfo || impInfo->getProcessed())
                {
                    reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BaseTypeNotFound, baseName);
                    throw TraverseSchema::InvalidComplexTypeInfo;
                }

                infoType = SchemaInfo::IMPORT;
                restoreSchemaInfo(impInfo, infoType);
              }
            }
        }
    }
    else {

        fBuffer.set(uriStr);
        fBuffer.append(chComma);
        fBuffer.append(localPart);

        // assume the base is a complexType and try to locate the base type first
        const XMLCh* fullBaseName = fBuffer.getRawBuffer();
        baseComplexTypeInfo = fComplexTypeRegistry->get(fullBaseName);

        // Circular check
        if (baseComplexTypeInfo) {

            if (fCurrentTypeNameStack->containsElement(fStringPool->addOrFind(fullBaseName), fCircularCheckIndex)) {

                reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::NoCircularDefinition, fullBaseName);
                throw TraverseSchema::InvalidComplexTypeInfo;
            }
            else if (fCurrentTypeNameStack->containsElement(fStringPool->addOrFind(fullBaseName))) {

                typeInfo->setBaseComplexTypeInfo(baseComplexTypeInfo);
                throw TraverseSchema::RecursingElement;
            }
            else if (baseComplexTypeInfo->getPreprocessed()) {
                baseComplexTypeInfo = 0;
            }
        }
    }

    // if not found, 2 possibilities:
    //           1: ComplexType in question has not been compiled yet;
    //           2: base is SimpleType;
    if (!baseComplexTypeInfo && !baseDTValidator) {

        baseDTValidator = getDatatypeValidator(uriStr, localPart);

        if (baseDTValidator == 0) {

            DOMElement* baseTypeNode = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_ComplexType,
                SchemaSymbols::fgELT_COMPLEXTYPE, localPart, &fSchemaInfo);

            if (baseTypeNode != 0) {

                int baseTypeSymbol = traverseComplexTypeDecl(baseTypeNode);
                baseComplexTypeInfo = fComplexTypeRegistry->get(fStringPool->getValueForId(baseTypeSymbol));
            }
            else {

                baseTypeNode = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_SimpleType,
                    SchemaSymbols::fgELT_SIMPLETYPE, localPart, &fSchemaInfo);

                if (baseTypeNode != 0) {

                    baseDTValidator = traverseSimpleTypeDecl(baseTypeNode);

                    if (baseDTValidator == 0)  {

                        // restore schema information, if necessary
                        if (saveInfo != fSchemaInfo) {
                            restoreSchemaInfo(saveInfo, infoType, saveScope);
                        }

                        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, uriStr, localPart, uriStr);
                        throw TraverseSchema::InvalidComplexTypeInfo;
                    }
                }
                else {

                    // restore schema information, if necessary
                    if (saveInfo != fSchemaInfo) {
                        restoreSchemaInfo(saveInfo, infoType, saveScope);
                    }
                    reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::BaseTypeNotFound, baseName);
                    throw TraverseSchema::InvalidComplexTypeInfo;
                }
            }
        }
    } // end if

    // restore schema information, if necessary
    if (saveInfo != fSchemaInfo) {
        restoreSchemaInfo(saveInfo, infoType, saveScope);
    }

    typeInfo->setBaseComplexTypeInfo(baseComplexTypeInfo);
    typeInfo->setBaseDatatypeValidator(baseDTValidator);
}